

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMemMMSPImm5Lsl2(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint RC;
  uint32_t RegNo;
  uint Reg_00;
  MCRegisterInfo *in_RCX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg;
  uint Offset;
  
  RC = in_ESI & 0x1f;
  RegNo = fieldFromInstruction(in_ESI,5,5);
  Reg_00 = getReg(in_RCX,RC,RegNo);
  MCOperand_CreateReg0(in_RDI,Reg_00);
  MCOperand_CreateReg0(in_RDI,0x14);
  MCOperand_CreateImm0(in_RDI,(ulong)(RC << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemMMSPImm5Lsl2(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Offset = Insn & 0x1F;
	unsigned Reg = fieldFromInstruction(Insn, 5, 5);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Mips_SP);
	MCOperand_CreateImm0(Inst, Offset << 2);

	return MCDisassembler_Success;
}